

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O0

Am_Value get_real_string_from_inter_val_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar3;
  Am_Object *in_RSI;
  Am_Value AVar4;
  Am_Object local_48;
  Am_Object button;
  undefined1 local_30 [8];
  Am_Value v;
  Am_Object *self_local;
  Am_Value *value;
  
  v.value.long_value._7_1_ = 0;
  Am_Value::Am_Value((Am_Value *)self);
  Am_Value::Am_Value((Am_Value *)local_30);
  pAVar2 = Am_Object::Peek(in_RSI,0x1d4,0);
  Am_Value::operator=((Am_Value *)local_30,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)local_30);
  if (bVar1) {
    Am_Object::Am_Object(&local_48,(Am_Value *)local_30);
    pAVar2 = Am_Object::Peek(&local_48,0x1ae,0);
    Am_Value::operator=((Am_Value *)self,pAVar2);
    Am_Object::~Am_Object(&local_48);
  }
  v.value.long_value._7_1_ = 1;
  Am_Value::~Am_Value((Am_Value *)local_30);
  aVar3 = extraout_RDX;
  if ((v.value.long_value._7_1_ & 1) == 0) {
    Am_Value::~Am_Value((Am_Value *)self);
    aVar3 = extraout_RDX_00;
  }
  AVar4.value.wrapper_value = aVar3.wrapper_value;
  AVar4._0_8_ = self;
  return AVar4;
}

Assistant:

Am_Define_Formula(Am_Value, get_real_string_from_inter_val)
{
  Am_Value value;
  Am_Value v;
  v = self.Peek(Am_COMPUTE_INTER_VALUE);
  if (v.Valid()) {
    Am_Object button = v;
    value = button.Peek(Am_REAL_STRING_OR_OBJ);
  }
  return value;
}